

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<86UL> *
mserialize::cx_strcat<1ul,1ul,30ul,1ul,6ul,3ul,6ul,4ul,10ul,16ul,7ul,1ul>
          (cx_string<1UL> *strings,cx_string<1UL> *strings_1,cx_string<30UL> *strings_2,
          cx_string<1UL> *strings_3,cx_string<6UL> *strings_4,cx_string<3UL> *strings_5,
          cx_string<6UL> *strings_6,cx_string<4UL> *strings_7,cx_string<10UL> *strings_8,
          cx_string<16UL> *strings_9,cx_string<7UL> *strings_10,cx_string<1UL> *strings_11)

{
  cx_string<30UL> *in_RCX;
  cx_string<1UL> *in_RDX;
  cx_string<1UL> *in_RSI;
  cx_string<86UL> *in_RDI;
  cx_string<1UL> *in_R8;
  cx_string<6UL> *in_R9;
  cx_string<3UL> *in_stack_00000008;
  cx_string<6UL> *in_stack_00000010;
  size_t s;
  size_t i;
  char *out;
  size_t size [13];
  char *data [13];
  char buffer [87];
  char *in_stack_fffffffffffffe80;
  ulong local_178;
  char *local_170;
  size_t local_160 [13];
  char *local_f8;
  data_ref local_f0 [2];
  data_ref local_e0;
  data_ref local_d8;
  data_ref local_d0;
  data_ref local_c8;
  data_ref local_c0;
  data_ref local_b8;
  data_ref local_b0;
  data_ref local_a8;
  data_ref local_a0;
  data_ref local_98;
  char local_88 [96];
  cx_string<6UL> *local_28;
  cx_string<1UL> *local_20;
  cx_string<30UL> *local_18;
  cx_string<1UL> *local_10;
  cx_string<1UL> *local_8;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  memset(local_88,0,0x57);
  local_f8 = "";
  local_f0[0] = cx_string<1UL>::data(local_8);
  local_f0[1] = cx_string<1UL>::data(local_10);
  local_e0 = cx_string<30UL>::data(local_18);
  local_d8 = cx_string<1UL>::data(local_20);
  local_d0 = cx_string<6UL>::data(local_28);
  local_c8 = cx_string<3UL>::data(in_stack_00000008);
  local_c0 = cx_string<6UL>::data(in_stack_00000010);
  local_b8 = cx_string<4UL>::data((cx_string<4UL> *)s);
  local_b0 = cx_string<10UL>::data((cx_string<10UL> *)i);
  local_a8 = cx_string<16UL>::data((cx_string<16UL> *)out);
  local_a0 = cx_string<7UL>::data((cx_string<7UL> *)size[0]);
  local_98 = cx_string<1UL>::data((cx_string<1UL> *)size[1]);
  local_160[0] = cx_string<1UL>::size(local_8);
  local_160[1] = cx_string<1UL>::size(local_10);
  local_160[2] = cx_string<30UL>::size(local_18);
  local_160[3] = cx_string<1UL>::size(local_20);
  local_160[4] = cx_string<6UL>::size(local_28);
  local_160[5] = cx_string<3UL>::size(in_stack_00000008);
  local_160[6] = cx_string<6UL>::size(in_stack_00000010);
  local_160[7] = cx_string<4UL>::size((cx_string<4UL> *)s);
  local_160[8] = cx_string<10UL>::size((cx_string<10UL> *)i);
  local_160[9] = cx_string<16UL>::size((cx_string<16UL> *)out);
  local_160[10] = cx_string<7UL>::size((cx_string<7UL> *)size[0]);
  local_160[0xb] = cx_string<1UL>::size((cx_string<1UL> *)size[1]);
  local_170 = local_88;
  for (local_178 = 1; local_178 < 0xd; local_178 = local_178 + 1) {
    for (in_stack_fffffffffffffe80 = (char *)0x0;
        in_stack_fffffffffffffe80 < (cx_string<86UL> *)local_160[local_178 - 1];
        in_stack_fffffffffffffe80 = in_stack_fffffffffffffe80 + 1) {
      *local_170 = in_stack_fffffffffffffe80[(long)local_f0[local_178 - 1]];
      local_170 = local_170 + 1;
    }
  }
  cx_string<86UL>::cx_string((cx_string<86UL> *)in_stack_fffffffffffffe80,in_RDI->_data);
  return in_RDI;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}